

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyReadDeriveStrength(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Scl_Item_t *pSVar6;
  
  uVar1 = pCell->Child;
  iVar4 = p->nItems;
  if ((int)uVar1 < iVar4) {
    if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
      pSVar6 = p->pItems + uVar1;
      pcVar5 = p->pContents;
      do {
        iVar3 = (pSVar6->Key).Beg;
        iVar2 = (pSVar6->Key).End - iVar3;
        iVar3 = strncmp(pcVar5 + iVar3,"drive_strength",(long)iVar2);
        if (iVar2 == 0xe && iVar3 == 0) {
          pcVar5 = Scl_LibertyReadString(p,pSVar6->Head);
          iVar4 = atoi(pcVar5);
          return iVar4;
        }
        uVar1 = pSVar6->Next;
        if (iVar4 <= (int)uVar1) goto LAB_003e6e91;
      } while ((-1 < (int)uVar1) && (pSVar6 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
    }
    return 0;
  }
LAB_003e6e91:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyReadDeriveStrength( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, pCell, pItem, "drive_strength" )
        return atoi(Scl_LibertyReadString(p, pItem->Head));
    return 0;
}